

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BrotliStoreHuffmanTree
               (uint8_t *depths,size_t num,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *__assertion;
  ulong uVar10;
  bool bVar11;
  uint8_t code_length_bitdepth [18];
  size_t huffman_tree_size;
  uint32_t huffman_tree_histogram [18];
  uint16_t code_length_bitdepth_symbols [18];
  uint8_t huffman_tree_extra_bits [704];
  uint8_t huffman_tree [704];
  
  huffman_tree_size = 0;
  code_length_bitdepth[0] = '\0';
  code_length_bitdepth[1] = '\0';
  code_length_bitdepth[2] = '\0';
  code_length_bitdepth[3] = '\0';
  code_length_bitdepth[4] = '\0';
  code_length_bitdepth[5] = '\0';
  code_length_bitdepth[6] = '\0';
  code_length_bitdepth[7] = '\0';
  code_length_bitdepth[8] = '\0';
  code_length_bitdepth[9] = '\0';
  code_length_bitdepth[10] = '\0';
  code_length_bitdepth[0xb] = '\0';
  code_length_bitdepth[0xc] = '\0';
  code_length_bitdepth[0xd] = '\0';
  code_length_bitdepth[0xe] = '\0';
  code_length_bitdepth[0xf] = '\0';
  code_length_bitdepth[0x10] = '\0';
  code_length_bitdepth[0x11] = '\0';
  huffman_tree_histogram[0xc] = 0;
  huffman_tree_histogram[0xd] = 0;
  huffman_tree_histogram[0xe] = 0;
  huffman_tree_histogram[0xf] = 0;
  huffman_tree_histogram[8] = 0;
  huffman_tree_histogram[9] = 0;
  huffman_tree_histogram[10] = 0;
  huffman_tree_histogram[0xb] = 0;
  huffman_tree_histogram[4] = 0;
  huffman_tree_histogram[5] = 0;
  huffman_tree_histogram[6] = 0;
  huffman_tree_histogram[7] = 0;
  huffman_tree_histogram[0] = 0;
  huffman_tree_histogram[1] = 0;
  huffman_tree_histogram[2] = 0;
  huffman_tree_histogram[3] = 0;
  huffman_tree_histogram[0x10] = 0;
  huffman_tree_histogram[0x11] = 0;
  if (0x2c0 < num) {
    __assert_fail("num <= BROTLI_NUM_COMMAND_SYMBOLS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                  ,0x13a,
                  "void BrotliStoreHuffmanTree(const uint8_t *, size_t, HuffmanTree *, size_t *, uint8_t *)"
                 );
  }
  BrotliWriteHuffmanTree(depths,num,&huffman_tree_size,huffman_tree,huffman_tree_extra_bits);
  for (sVar2 = 0; huffman_tree_size != sVar2; sVar2 = sVar2 + 1) {
    huffman_tree_histogram[huffman_tree[sVar2]] = huffman_tree_histogram[huffman_tree[sVar2]] + 1;
  }
  uVar5 = 0;
  lVar7 = 0;
  for (lVar3 = 0; lVar3 != 0x12; lVar3 = lVar3 + 1) {
    lVar8 = lVar7;
    if ((huffman_tree_histogram[lVar3] != 0) &&
       (bVar11 = uVar5 != 0, uVar5 = 1, lVar8 = lVar3, bVar11)) {
      uVar5 = 2;
      break;
    }
    lVar7 = lVar8;
  }
  uVar10 = 0x12;
  BrotliCreateHuffmanTree(huffman_tree_histogram,0x12,5,tree,code_length_bitdepth);
  BrotliConvertBitDepthsToSymbols(code_length_bitdepth,0x12,code_length_bitdepth_symbols);
  if (1 < uVar5) {
    uVar10 = 0x12;
    do {
      if (code_length_bitdepth[*(byte *)((long)kStaticDistanceCodeBits + uVar10 + 0x7f)] != '\0')
      goto LAB_001145c3;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    uVar10 = 0;
  }
LAB_001145c3:
  uVar9 = (ulong)(code_length_bitdepth[3] == '\0') + 2;
  if (code_length_bitdepth[2] != '\0' || code_length_bitdepth[1] != '\0') {
    uVar9 = 0;
  }
  uVar6 = *storage_ix;
  *(ulong *)(storage + (uVar6 >> 3)) = uVar9 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
  uVar6 = uVar6 + 2;
  *storage_ix = uVar6;
  for (; uVar9 < uVar10; uVar9 = uVar9 + 1) {
    bVar4 = *(byte *)((long)&
                            BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kHuffmanBitLengthHuffmanCodeBitLengths
                     + (ulong)code_length_bitdepth
                              [(byte)(&BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder)
                                     [uVar9]]);
    bVar1 = *(byte *)((long)&
                            BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kHuffmanBitLengthHuffmanCodeSymbols
                     + (ulong)code_length_bitdepth
                              [(byte)(&BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder)
                                     [uVar9]]);
    if (bVar1 >> (bVar4 & 0x3f) != 0) goto LAB_00114740;
    *(ulong *)(storage + (uVar6 >> 3)) =
         (ulong)bVar1 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
    uVar6 = uVar6 + bVar4;
    *storage_ix = uVar6;
  }
  if (uVar5 == 1) {
    code_length_bitdepth[lVar7] = '\0';
  }
  sVar2 = 0;
  while( true ) {
    if (huffman_tree_size == sVar2) {
      return;
    }
    bVar4 = huffman_tree[sVar2];
    bVar1 = code_length_bitdepth[bVar4];
    if (code_length_bitdepth_symbols[bVar4] >> (bVar1 & 0x3f) != 0) goto LAB_00114740;
    if (0x38 < bVar1) break;
    *(ulong *)(storage + (uVar6 >> 3)) =
         (ulong)code_length_bitdepth_symbols[bVar4] << ((byte)uVar6 & 7) |
         (ulong)storage[uVar6 >> 3];
    uVar6 = bVar1 + uVar6;
    *storage_ix = uVar6;
    if (bVar4 == 0x11) {
      bVar4 = huffman_tree_extra_bits[sVar2];
      lVar7 = 3;
      if (7 < bVar4) goto LAB_00114740;
LAB_001146fe:
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)bVar4 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      uVar6 = uVar6 + lVar7;
      *storage_ix = uVar6;
    }
    else if (bVar4 == 0x10) {
      bVar4 = huffman_tree_extra_bits[sVar2];
      lVar7 = 2;
      if (bVar4 < 4) goto LAB_001146fe;
      goto LAB_00114740;
    }
    sVar2 = sVar2 + 1;
  }
  __assertion = "n_bits <= 56";
  uVar5 = 0x37;
LAB_00114770:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,uVar5,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
               );
LAB_00114740:
  __assertion = "(bits >> n_bits) == 0";
  uVar5 = 0x36;
  goto LAB_00114770;
}

Assistant:

void BrotliStoreHuffmanTree(const uint8_t* depths, size_t num,
                            HuffmanTree* tree,
                            size_t *storage_ix, uint8_t *storage) {
  /* Write the Huffman tree into the brotli-representation.
     The command alphabet is the largest, so this allocation will fit all
     alphabets. */
  uint8_t huffman_tree[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t huffman_tree_extra_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t huffman_tree_size = 0;
  uint8_t code_length_bitdepth[BROTLI_CODE_LENGTH_CODES] = { 0 };
  uint16_t code_length_bitdepth_symbols[BROTLI_CODE_LENGTH_CODES];
  uint32_t huffman_tree_histogram[BROTLI_CODE_LENGTH_CODES] = { 0 };
  size_t i;
  int num_codes = 0;
  size_t code = 0;

  assert(num <= BROTLI_NUM_COMMAND_SYMBOLS);

  BrotliWriteHuffmanTree(depths, num, &huffman_tree_size, huffman_tree,
                         huffman_tree_extra_bits);

  /* Calculate the statistics of the Huffman tree in brotli-representation. */
  for (i = 0; i < huffman_tree_size; ++i) {
    ++huffman_tree_histogram[huffman_tree[i]];
  }

  for (i = 0; i < BROTLI_CODE_LENGTH_CODES; ++i) {
    if (huffman_tree_histogram[i]) {
      if (num_codes == 0) {
        code = i;
        num_codes = 1;
      } else if (num_codes == 1) {
        num_codes = 2;
        break;
      }
    }
  }

  /* Calculate another Huffman tree to use for compressing both the
     earlier Huffman tree with. */
  BrotliCreateHuffmanTree(huffman_tree_histogram, BROTLI_CODE_LENGTH_CODES,
                          5, tree, code_length_bitdepth);
  BrotliConvertBitDepthsToSymbols(code_length_bitdepth,
                                  BROTLI_CODE_LENGTH_CODES,
                                  code_length_bitdepth_symbols);

  /* Now, we have all the data, let's start storing it */
  BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(num_codes, code_length_bitdepth,
                                               storage_ix, storage);

  if (num_codes == 1) {
    code_length_bitdepth[code] = 0;
  }

  /* Store the real Huffman tree now. */
  BrotliStoreHuffmanTreeToBitMask(huffman_tree_size,
                                  huffman_tree,
                                  huffman_tree_extra_bits,
                                  code_length_bitdepth,
                                  code_length_bitdepth_symbols,
                                  storage_ix, storage);
}